

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O0

double erfinv(double target)

{
  ostream *this;
  double dVar1;
  double current;
  int k;
  double error;
  double dStack_28;
  int direction;
  double source;
  double stepsize;
  double target_local;
  
  source = 0.4;
  dStack_28 = 0.0;
  error._4_4_ = 1;
  if ((1.0 < target) || (target < -1.0)) {
    this = std::operator<<((ostream *)&std::cout,"argument for erfinv outside of domain");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    target_local = 0.0;
  }
  else if ((target != 0.0) || (NAN(target))) {
    if ((target != 1.0) || (NAN(target))) {
      if ((target != -1.0) || (NAN(target))) {
        for (current._4_4_ = 0; current._4_4_ < 1000000; current._4_4_ = current._4_4_ + 1) {
          dVar1 = erf(dStack_28);
          if (dVar1 <= target) {
            if (error._4_4_ == -1) {
              source = source * 0.6;
              error._4_4_ = 1;
            }
            else {
              source = source * 1.1;
            }
          }
          else if (error._4_4_ == 1) {
            source = source * 0.6;
            error._4_4_ = -1;
          }
          else {
            source = source * 1.1;
          }
          dStack_28 = (double)error._4_4_ * source + dStack_28;
          if (source < 1e-09) break;
        }
        target_local = dStack_28;
      }
      else {
        target_local = -1e+24;
      }
    }
    else {
      target_local = 1e+24;
    }
  }
  else {
    target_local = 0.0;
  }
  return target_local;
}

Assistant:

double erfinv(double target)
{
	double stepsize = 0.4; // starting stepsize
	double source = 0.0;
	int direction = 1; // current direction 1-up, -1-down
	double error = 0.000000001;
	
	if( target > 1.0 || target < -1.0 ) {
		cout << "argument for erfinv outside of domain" << endl;
		return 0.0; // I mean NaN
	}
	if( target==0.0 ) return 0.0;
	if( target==1.0 ) return 1e24; // replacement for inf
	if( target==-1.0 ) return -1e24; // replacement for -inf
	
	int k;
	for( k=0; k<1000000; k++) {
		double current = erf( source );
		
		if(current > target) {
			if(direction == 1) {
				// too large and direction up - decrease stepsize and turn
				stepsize *= 0.6;
				direction *= -1;
			} else
				// too large and direction down - increase stepsize
				stepsize *= 1.1;
		} else {
			if(direction == -1) {
				// too small and direction down - decrease stepsize and turn
				stepsize *= 0.6;
				direction *= -1;
			} else
				// too small and direction up - increase stepsize
				stepsize *= 1.1;
		}
		source += direction * stepsize;
		
		// early stopping
		if( stepsize < error )
			break;
	}
/*	// note
	cout << "erfinv(" << target 
		<< ") = " << source 
		<< ", stepsize = " << stepsize 
		<< ", " << k << " steps, "
		<< " error = " << erf(source) - target << endl;
*/	
	return source;
}